

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall spv::Builder::makeRayQueryType(Builder *this)

{
  Id IVar1;
  Instruction *instruction;
  pointer *__ptr;
  _Head_base<0UL,_spv::Instruction_*,_false> local_18;
  
  instruction = this->ray_query_type;
  if (instruction == (Instruction *)0x0) {
    instruction = (Instruction *)dxil_spv::allocate_in_thread(0x38);
    IVar1 = this->uniqueId + 1;
    this->uniqueId = IVar1;
    instruction->_vptr_Instruction = (_func_int **)&PTR__Instruction_001e31e0;
    instruction->resultId = IVar1;
    instruction->typeId = 0;
    instruction->opCode = OpTypeRayQueryKHR;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    instruction->block = (Block *)0x0;
    this->ray_query_type = instruction;
    local_18._M_head_impl = instruction;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&this->constantsTypesGlobals,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_18);
    if (local_18._M_head_impl != (Instruction *)0x0) {
      (*(local_18._M_head_impl)->_vptr_Instruction[1])();
    }
    Module::mapInstruction(&this->module,instruction);
  }
  return instruction->resultId;
}

Assistant:

Id Builder::makeRayQueryType()
{
    Instruction* type;
    if (!ray_query_type)
    {
        type = new Instruction(getUniqueId(), NoType, OpTypeRayQueryKHR);
        ray_query_type = type;
        constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
        module.mapInstruction(type);
    } else
        type = ray_query_type;

    return type->getResultId();
}